

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanio.c
# Opt level: O3

void Abc_ObjRemoveFanins(Abc_Obj_t *pObj)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  ulong uVar3;
  
  iVar2 = (pObj->vFanins).nSize;
  if (0 < (long)iVar2) {
    uVar3 = (long)iVar2 + 1;
    do {
      iVar2 = (pObj->vFanins).pArray[uVar3 - 2];
      if (((long)iVar2 < 0) || (pVVar1 = pObj->pNtk->vObjs, pVVar1->nSize <= iVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Abc_ObjDeleteFanin(pObj,(Abc_Obj_t *)pVVar1->pArray[iVar2]);
      uVar3 = uVar3 - 1;
    } while (1 < uVar3);
    iVar2 = (pObj->vFanins).nSize;
  }
  pObj->field_0x15 = pObj->field_0x15 & 0xf3;
  if (iVar2 == 0) {
    return;
  }
  __assert_fail("vFaninsOld->nSize == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                ,0x9b,"void Abc_ObjRemoveFanins(Abc_Obj_t *)");
}

Assistant:

void Abc_ObjRemoveFanins( Abc_Obj_t * pObj )
{
    Vec_Int_t * vFaninsOld;
    Abc_Obj_t * pFanin;
    int k;
    // remove old fanins
    vFaninsOld = &pObj->vFanins;
    for ( k = vFaninsOld->nSize - 1; k >= 0; k-- )
    {
        pFanin = Abc_NtkObj( pObj->pNtk, vFaninsOld->pArray[k] );
        Abc_ObjDeleteFanin( pObj, pFanin );
    }
    pObj->fCompl0 = 0;
    pObj->fCompl1 = 0;
    assert( vFaninsOld->nSize == 0 );
}